

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

CScript * __thiscall CScript::push_int64(CScript *this,int64_t n)

{
  void *pvVar1;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  int64_t local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = n;
  if (n == -1 || n - 1U < 0x10) {
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (char)n + 'P';
  }
  else {
    if (n != 0) {
      CScriptNum::serialize(&local_38,&local_20);
      operator<<(this,&local_38);
      pvVar1 = (void *)CONCAT71(local_38.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                (char)local_38.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_38.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar1);
      }
      goto LAB_003446fb;
    }
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = '\0';
  }
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)this,(uchar *)&local_38);
LAB_003446fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CScript& push_int64(int64_t n)
    {
        if (n == -1 || (n >= 1 && n <= 16))
        {
            push_back(n + (OP_1 - 1));
        }
        else if (n == 0)
        {
            push_back(OP_0);
        }
        else
        {
            *this << CScriptNum::serialize(n);
        }
        return *this;
    }